

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lru_cache.hpp
# Opt level: O0

optional<unsigned_long> __thiscall
cappuccino::
lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>
::do_find(lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>
          *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,peek peek)

{
  bool bVar1;
  pointer ppVar2;
  reference e_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  optional<unsigned_long> oVar4;
  element *e;
  size_t element_idx;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_38;
  iterator keyed_position;
  peek peek_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_local;
  lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  *this_local;
  bool local_10;
  
  keyed_position.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  ._M_cur._4_4_ = peek;
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               *)(this + 0x48),key);
  element_idx = (size_t)std::
                        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                        ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                               *)(this + 0x48));
  bVar1 = std::__detail::operator!=
                    (&local_38,
                     (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                      *)&element_idx);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
                           *)&local_38);
    e_00 = std::
           vector<cappuccino::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>::element>_>
           ::operator[]((vector<cappuccino::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>::element>_>
                         *)(this + 0x30),ppVar2->second);
    if (keyed_position.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
        ._M_cur._4_4_ == no) {
      do_access(this,e_00);
    }
    std::optional<unsigned_long>::optional<unsigned_long_&,_true>
              ((optional<unsigned_long> *)&this_local,&e_00->m_value);
    uVar3 = extraout_RDX;
  }
  else {
    std::optional<unsigned_long>::optional((optional<unsigned_long> *)&this_local);
    uVar3 = extraout_RDX_00;
  }
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_7_ = (undefined7)((ulong)uVar3 >> 8);
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = local_10;
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload = (_Storage<unsigned_long,_true>)this_local
  ;
  return (optional<unsigned_long>)
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

auto do_find(const key_type& key, peek peek) -> std::optional<value_type>
    {
        auto keyed_position = m_keyed_elements.find(key);
        if (keyed_position != m_keyed_elements.end())
        {
            size_t   element_idx = keyed_position->second;
            element& e           = m_elements[element_idx];
            // Don't update the elements access in the LRU if peeking.
            if (peek == peek::no)
            {
                do_access(e);
            }
            return {e.m_value};
        }

        return {};
    }